

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::emit_sof(jpeg_encoder *this)

{
  undefined1 uVar1;
  uint uVar3;
  undefined8 in_RAX;
  uint8 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  int iVar2;
  
  uStack_38 = in_RAX;
  emit_marker(this,0xc0);
  emit_word(this,(uint)this->m_num_components + (uint)this->m_num_components * 2 + 8);
  uStack_38._0_4_ = CONCAT13(8,(undefined3)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 3,1);
    uVar1 = (undefined1)iVar2;
  }
  else {
    uVar1 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar1;
  emit_word(this,this->m_image_y);
  emit_word(this,this->m_image_x);
  uVar4 = this->m_num_components;
  uStack_38._0_5_ = CONCAT14(uVar4,(undefined4)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    uVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 4,1);
    uVar4 = this->m_num_components;
  }
  else {
    uVar3 = 0;
  }
  this->m_all_stream_writes_succeeded = SUB41(uVar3,0);
  if (uVar4 != '\0') {
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      uStack_38._0_6_ = CONCAT15((char)uVar6,(undefined5)uStack_38);
      if ((uVar3 & 1) == 0) {
        this->m_all_stream_writes_succeeded = false;
LAB_0012b829:
        uVar3 = 0;
      }
      else {
        iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 5,1);
        this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
        uStack_38._0_7_ =
             CONCAT16(this->m_comp_h_samp[uVar5] * '\x10' + this->m_comp_v_samp[uVar5],
                      (undefined6)uStack_38);
        if (SUB41(iVar2,0) == false) goto LAB_0012b829;
        iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
        this->m_all_stream_writes_succeeded = SUB41(iVar2,0);
        uStack_38 = CONCAT17(uVar5 != 0,(undefined7)uStack_38);
        if (SUB41(iVar2,0) == false) goto LAB_0012b829;
        uVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
      }
      this->m_all_stream_writes_succeeded = SUB41(uVar3,0);
      uVar5 = uVar6;
    } while (uVar6 < this->m_num_components);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_sof() {
  emit_marker(M_SOF0); /* baseline */
  emit_word(3 * m_num_components + 2 + 5 + 1);
  emit_byte(8); /* precision */
  emit_word(m_image_y);
  emit_word(m_image_x);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));                  /* component ID     */
    emit_byte((m_comp_h_samp[i] << 4) + m_comp_v_samp[i]); /* h and v sampling */
    emit_byte(i > 0);                                      /* quant. table num */
  }
}